

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_expression.cpp
# Opt level: O3

void __thiscall
FxFRandom::FxFRandom
          (FxFRandom *this,FRandom *r,FxExpression *mi,FxExpression *ma,FScriptPosition *pos)

{
  PInt *pPVar1;
  FxExpression *pFVar2;
  PType *pPVar3;
  
  FxExpression::FxExpression((FxExpression *)this,pos);
  (this->super_FxRandom).super_FxExpression.field_0x31 = 0;
  (this->super_FxRandom).min = (FxExpression *)0x0;
  (this->super_FxRandom).max = (FxExpression *)0x0;
  pPVar1 = TypeSInt32;
  (this->super_FxRandom).rng = r;
  (this->super_FxRandom).super_FxExpression.ValueType = (PType *)pPVar1;
  (this->super_FxRandom).super_FxExpression._vptr_FxExpression =
       (_func_int **)&PTR__FxRandom_0088ec00;
  pPVar3 = (PType *)TypeFloat64;
  if (mi != (FxExpression *)0x0 && ma != (FxExpression *)0x0) {
    pFVar2 = (FxExpression *)operator_new(0x40);
    FxExpression::FxExpression(pFVar2,&mi->ScriptPosition);
    pFVar2->_vptr_FxExpression = (_func_int **)&PTR__FxFloatCast_0088e520;
    pFVar2[1]._vptr_FxExpression = (_func_int **)mi;
    pFVar2->ValueType = (PType *)TypeFloat64;
    (this->super_FxRandom).min = pFVar2;
    pFVar2 = (FxExpression *)operator_new(0x40);
    FxExpression::FxExpression(pFVar2,&ma->ScriptPosition);
    pFVar2->_vptr_FxExpression = (_func_int **)&PTR__FxFloatCast_0088e520;
    pFVar2[1]._vptr_FxExpression = (_func_int **)ma;
    pPVar3 = (PType *)TypeFloat64;
    pFVar2->ValueType = (PType *)TypeFloat64;
    (this->super_FxRandom).max = pFVar2;
  }
  (this->super_FxRandom).super_FxExpression.ValueType = pPVar3;
  return;
}

Assistant:

FxFRandom::FxFRandom(FRandom *r, FxExpression *mi, FxExpression *ma, const FScriptPosition &pos)
: FxRandom(r, NULL, NULL, pos)
{
	if (mi != NULL && ma != NULL)
	{
		min = new FxFloatCast(mi);
		max = new FxFloatCast(ma);
	}
	ValueType = TypeFloat64;
}